

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

void gl4cts::BufferStorage::Framebuffer::Generate(Functions *gl,GLuint *out_id)

{
  GLenum err;
  TestError *this;
  GLuint id;
  
  id = 0xffffffff;
  (*gl->genFramebuffers)(1,&id);
  err = (*gl->getError)();
  glu::checkError(err,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x3ab);
  if (id != 0xffffffff) {
    *out_id = id;
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invalid id",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
             ,0x3af);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Framebuffer::Generate(const glw::Functions& gl, glw::GLuint& out_id)
{
	GLuint id = m_invalid_id;

	gl.genFramebuffers(1, &id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");

	if (m_invalid_id == id)
	{
		TCU_FAIL("Invalid id");
	}

	out_id = id;
}